

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

void __thiscall QPDF::setLastObjectDescription(QPDF *this,string *description,QPDFObjGen og)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long local_50;
  long lStack_48;
  QPDFObjGen local_40;
  string local_38;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  *(size_type *)((long)&(_Var1._M_head_impl)->last_object_description + 8) = 0;
  *((_Var1._M_head_impl)->last_object_description)._M_dataplus._M_p = 0;
  local_40 = og;
  if (description->_M_string_length == 0) {
    if (og.obj == 0) {
      return;
    }
  }
  else {
    std::__cxx11::string::_M_append
              ((char *)&((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                        last_object_description,(ulong)(description->_M_dataplus)._M_p);
    if (og.obj == 0) {
      return;
    }
    std::__cxx11::string::append
              ((char *)&((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                        last_object_description);
  }
  QPDFObjGen::unparse_abi_cxx11_(&local_38,&local_40,' ');
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x27840a);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    plVar4 = &local_50;
  }
  else {
    local_50 = *plVar3;
    plVar4 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append
            ((char *)&((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                      last_object_description,(ulong)plVar4);
  if (plVar4 != &local_50) {
    operator_delete(plVar4,local_50 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDF::setLastObjectDescription(std::string const& description, QPDFObjGen og)
{
    m->last_object_description.clear();
    if (!description.empty()) {
        m->last_object_description += description;
        if (og.isIndirect()) {
            m->last_object_description += ": ";
        }
    }
    if (og.isIndirect()) {
        m->last_object_description += "object " + og.unparse(' ');
    }
}